

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_dispatcher.cpp
# Opt level: O1

void __thiscall
cppcms::url_dispatcher::map_generic(url_dispatcher *this,regex *re,generic_handler *h)

{
  generic_option *__p;
  shared_ptr<cppcms::(anonymous_namespace)::option> opt;
  shared_ptr<cppcms::(anonymous_namespace)::option> local_30;
  
  __p = (generic_option *)operator_new(0x88);
  anon_unknown_0::option::option((option *)__p,re);
  (__p->super_option)._vptr_option = (_func_int **)&PTR__generic_option_00288d18;
  std::function<bool_(cppcms::application_&,_const_booster::match_results<const_char_*>_&)>::
  function(&__p->handle_,h);
  std::shared_ptr<cppcms::(anonymous_namespace)::option>::
  shared_ptr<cppcms::(anonymous_namespace)::generic_option,void>(&local_30,__p);
  std::
  vector<std::shared_ptr<cppcms::(anonymous_namespace)::option>,_std::allocator<std::shared_ptr<cppcms::(anonymous_namespace)::option>_>_>
  ::push_back(&((this->d).ptr_)->options,&local_30);
  if (local_30.super___shared_ptr<cppcms::(anonymous_namespace)::option,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_30.
               super___shared_ptr<cppcms::(anonymous_namespace)::option,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
    return;
  }
  return;
}

Assistant:

void url_dispatcher::map_generic(booster::regex const &re,generic_handler const &h)
	{
		booster::shared_ptr<option> opt(new generic_option(re,h));
		d->options.push_back(opt);
	}